

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::localityModifiers(string *unit,uint64_t match_flags)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  size_type __pos;
  string *this;
  long lVar8;
  precise_unit pVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nunit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if (unit->_M_string_length < 3) {
LAB_0034173f:
    pVar9.base_units_ = (unit_data)0xfa94a488;
    pVar9.commodity_ = 0;
    pVar9.multiplier_ = NAN;
  }
  else {
    pcVar2 = (unit->_M_dataplus)._M_p;
    if ((*pcVar2 == 'u') && ((pcVar2[1] == 'S' || (pcVar2[1] == 'K')))) {
      *pcVar2 = 'U';
    }
    for (lVar8 = 8; lVar8 != 1000; lVar8 = lVar8 + 0x10) {
      pcVar2 = *(char **)(wordModifiers(std::__cxx11::string&)::modifiers + lVar8 + 0x4d8);
      sVar7 = strlen(pcVar2);
      if (sVar7 == 2) {
        pcVar3 = *(char **)((long)&localityModifiers::internationlReplacements._M_elems[0].first +
                           lVar8);
        iVar6 = strncmp(pcVar2,pcVar3,2);
        if (iVar6 != 0) {
LAB_00341808:
          pcVar3 = (unit->_M_dataplus)._M_p;
          cVar1 = pcVar3[1];
          if (0 < cVar1) {
            iVar6 = isupper((int)cVar1);
            if (iVar6 != 0) {
              iVar6 = toupper((int)*pcVar3);
              if ((iVar6 == *pcVar2) && (cVar1 == pcVar2[1])) {
                *pcVar3 = (char)iVar6;
              }
            }
          }
          goto LAB_0034183b;
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90.field_2._M_allocated_capacity._0_2_ = 0x5f;
        local_90._M_string_length = 1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nunit,
                       &local_90,pcVar3);
        bVar4 = ends_with(unit,(string *)&nunit);
        std::__cxx11::string::~string((string *)&nunit);
        std::__cxx11::string::~string((string *)&local_90);
        if (!bVar4) goto LAB_00341808;
      }
      else {
LAB_0034183b:
        __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(unit,pcVar2,0);
        if (__pos != 0xffffffffffffffff) {
          sVar7 = strlen(pcVar2);
          if (sVar7 == unit->_M_string_length) goto LAB_00341993;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,__pos,
                sVar7);
          if ((__pos != 0) && ((unit->_M_dataplus)._M_p[__pos - 1] == '_')) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,
                  __pos - 1,1);
          }
          if ((__pos < unit->_M_string_length) && ((unit->_M_dataplus)._M_p[__pos] == '_')) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,__pos,1)
            ;
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,'_');
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,
                 *(char **)((long)&localityModifiers::internationlReplacements._M_elems[0].first +
                           lVar8));
          bVar4 = true;
          goto LAB_003418df;
        }
      }
    }
    bVar4 = false;
LAB_003418df:
    bVar5 = clearEmptySegments(unit);
    if (bVar5 || bVar4) {
      std::__cxx11::string::string
                ((string *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit);
      pVar9 = unit_from_string_internal(&local_50,match_flags | 0xc00000);
      std::__cxx11::string::~string((string *)&local_50);
      if ((((uint)match_flags >> 0x16 & 1) == 0) &&
         (NAN(pVar9.multiplier_) || (pVar9._8_8_ & 0xffffffff) == 0xfa94a488)) {
        std::__cxx11::string::string
                  ((string *)&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit);
        pVar9 = localityModifiers(&local_70,match_flags | 0x400000);
        this = &local_70;
LAB_0034197f:
        std::__cxx11::string::~string((string *)this);
      }
    }
    else if (unit->_M_string_length < 4) {
LAB_00341993:
      pVar9.base_units_ = (unit_data)0xfa94a488;
      pVar9.commodity_ = 0;
      pVar9.multiplier_ = NAN;
    }
    else {
      lVar8 = 0;
      do {
        if (lVar8 == 0x38) goto LAB_0034173f;
        pcVar2 = *(char **)((long)localityModifiers::rotSequences._M_elems + lVar8);
        iVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,
                          0,2,pcVar2);
        if (iVar6 == 0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nunit,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,
                 (ulong)((unit->_M_dataplus)._M_p[3] == '_') | 2,0xffffffffffffffff);
          if (nunit._M_dataplus._M_p[nunit._M_string_length - 1] == 's') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nunit);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nunit,'_')
          ;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nunit,pcVar2)
          ;
          pVar9 = get_unit(&nunit,match_flags);
          this = &nunit;
          goto LAB_0034197f;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nunit,pcVar2,(allocator<char> *)&local_90);
        bVar4 = ends_with(unit,&nunit);
        std::__cxx11::string::~string((string *)&nunit);
        lVar8 = lVar8 + 8;
      } while (!bVar4);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit,
                 (__const_iterator)((unit->_M_dataplus)._M_p + (unit->_M_string_length - 2)),'_');
      pVar9 = get_unit(unit,match_flags);
    }
  }
  return pVar9;
}

Assistant:

static precise_unit
    localityModifiers(std::string unit, std::uint64_t match_flags)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 62>
        internationlReplacements{{
            ckpair{"internationaltable", "IT"},
            ckpair{"internationalsteamtable", "IT"},
            ckpair{"international", "i"},
            ckpair{"USandBritish", "av"},
            ckpair{"US&British", "av"},
            ckpair{"USAsurvey", "US"},
            ckpair{"USsurvey", "US"},
            ckpair{"USSurvey", "US"},
            ckpair{"USdry", "US"},
            ckpair{"USA", "US"},
            ckpair{"USstatute", "US"},
            ckpair{"statutory", "US"},
            ckpair{"statute", "US"},
            ckpair{"US", "US"},
            ckpair{"shipping", "ship"},
            ckpair{"gregorian", "g"},
            ckpair{"Gregorian", "g"},
            ckpair{"synodic", "s"},
            ckpair{"sidereal", "sdr"},
            ckpair{"julian", "j"},
            ckpair{"Julian", "j"},
            ckpair{"thermochemical", "th"},
            ckpair{"hydraulic", "mech"},
            ckpair{"Th", "th"},
            ckpair{"(th)", "th"},
            ckpair{"metric", "m"},
            ckpair{"mean", "m"},
            ckpair{"imperial", "br"},
            ckpair{"Imperial", "br"},
            ckpair{"English", "br"},
            ckpair{"imp", "br"},
            ckpair{"wine", "wine"},
            ckpair{"beer", "wine"},
            ckpair{"(IT)", "IT"},
            ckpair{"troy", "tr"},
            ckpair{"apothecary", "ap"},
            ckpair{"apothecaries", "ap"},
            ckpair{"avoirdupois", "av"},
            ckpair{"Chinese", "cn"},
            ckpair{"chinese", "cn"},
            ckpair{"Canadian", "ca"},
            ckpair{"canadian", "ca"},
            ckpair{"survey", "US"},
            ckpair{"tropical", "t"},
            ckpair{"British", "br"},
            ckpair{"british", "br"},
            ckpair{"Br", "br"},
            ckpair{"BR", "br"},
            ckpair{"UK", "br"},
            ckpair{"conventional", "90"},
            ckpair{"AC", "ac"},
            ckpair{"DC", "dc"},
            ckpair{"fluid", "FL"},
            ckpair{"liquid", "FL"},
            ckpair{"fl", "FL"},
            ckpair{"15degC", "[15]"},
            ckpair{"20degC", "[20]"},
            ckpair{"59degF", "[59]"},
            ckpair{"60degF", "[60]"},
            ckpair{"39degF", "[39]"},
            ckpair{"0degC", "[00]"},
            // this should be last

            ckpair{"us", "US"},
        }};
    if (unit.size() < 3) {
        return precise::invalid;
    }
    if (unit.front() == 'u' && (unit[1] == 'S' || unit[1] == 'K')) {
        unit.front() = 'U';
    }
    bool changed = false;
    for (const auto& irep : internationlReplacements) {
        if (strlen(irep.first) == 2) {
            if (strncmp(irep.first, irep.second, 2) == 0) {
                if (ends_with(unit, std::string(1, '_') + irep.second)) {
                    continue;
                }
            }
            if (unit[1] > 0 && (std::isupper(unit[1]) != 0) &&
                (std::toupper(unit[0]) == irep.first[0]) &&
                (unit[1] == irep.first[1])) {
                unit[0] = std::toupper(unit[0]);
            }
        }
        auto fnd = unit.find(irep.first);
        if (fnd != std::string::npos) {
            auto len = strlen(irep.first);
            if (len == unit.size()) {  // this is a modifier if we are checking
                                       // the entire unit this is automatically
                                       // false
                return precise::invalid;
            }
            unit.erase(fnd, len);
            if (fnd > 0 && unit[fnd - 1] == '_') {
                unit.erase(fnd - 1, 1);
            }
            if (fnd < unit.size() && unit[fnd] == '_') {
                unit.erase(fnd, 1);
            }
            unit.push_back('_');
            unit.append(irep.second);
            changed = true;
            break;
        }
    }
    changed |= clearEmptySegments(unit);
    if (changed) {
        auto retunit = unit_from_string_internal(
            unit, match_flags | no_locality_modifiers | no_of_operator);
        if (is_error(retunit) && ((match_flags & no_locality_modifiers) == 0)) {
            return localityModifiers(unit, match_flags | no_locality_modifiers);
        }
        return retunit;
    }
    if (unit.size() < 4) {
        return precise::invalid;
    }
    static constexpr std::array<const char*, 7> rotSequences{
        {"br", "av", "ch", "IT", "th", "ap", "tr"}};
    for (const auto& seq : rotSequences) {
        if (unit.compare(0, 2, seq) == 0) {
            auto nunit = unit.substr((unit[3] == '_') ? 3 : 2);
            if (nunit.back() == 's') {
                nunit.pop_back();
            }
            nunit.push_back('_');
            nunit.append(seq);
            return get_unit(nunit, match_flags);
        }
        if (ends_with(unit, seq)) {
            unit.insert(unit.end() - 2, '_');
            return get_unit(unit, match_flags);
        }
    }

    return precise::invalid;
}